

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testMajorAxis<Imath_2_5::Vec3<short>>(char *type)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  ulong uVar5;
  size_type sVar6;
  short *psVar7;
  char *in_RDI;
  Box<Imath_2_5::Vec3<short>_> b_2;
  Vec3<short> max;
  uint j_1;
  uint i_1;
  uint j;
  Vec3<short> size;
  uint major;
  Box<Imath_2_5::Vec3<short>_> b_1;
  uint i;
  vector<Imath_2_5::Vec3<short>,_std::allocator<Imath_2_5::Vec3<short>_>_> perms;
  Box<Imath_2_5::Vec3<short>_> b;
  undefined4 in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  int in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  Box<Imath_2_5::Vec3<short>_> *in_stack_ffffffffffffff60;
  Vec3<short> local_88 [3];
  Vec3<short> local_76;
  undefined4 in_stack_ffffffffffffff90;
  uint i_00;
  undefined4 in_stack_ffffffffffffff94;
  uint uVar8;
  uint local_68;
  Vec3<short> local_64;
  Vec3<short> local_5e;
  uint local_58;
  Vec3<short> local_52 [3];
  uint local_40;
  vector<Imath_2_5::Vec3<short>,_std::allocator<Imath_2_5::Vec3<short>_>_> local_30;
  char *local_8;
  
  local_8 = in_RDI;
  poVar4 = std::operator<<((ostream *)&std::cout,"    majorAxis() for type ");
  poVar4 = std::operator<<(poVar4,local_8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Imath_2_5::Box<Imath_2_5::Vec3<short>_>::Box
            ((Box<Imath_2_5::Vec3<short>_> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  uVar1 = Imath_2_5::Box<Imath_2_5::Vec3<short>_>::majorAxis(in_stack_ffffffffffffff60);
  if (uVar1 != 0) {
    __assert_fail("b.majorAxis() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x394,
                  "void (anonymous namespace)::testMajorAxis(const char *) [T = Imath_2_5::Vec3<short>]"
                 );
  }
  std::vector<Imath_2_5::Vec3<short>,_std::allocator<Imath_2_5::Vec3<short>_>_>::vector
            ((vector<Imath_2_5::Vec3<short>,_std::allocator<Imath_2_5::Vec3<short>_>_> *)0x125d53);
  permutations<Imath_2_5::Vec3<short>>
            ((vector<Imath_2_5::Vec3<short>,_std::allocator<Imath_2_5::Vec3<short>_>_> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  local_40 = 0;
  while( true ) {
    uVar5 = (ulong)local_40;
    sVar6 = std::vector<Imath_2_5::Vec3<short>,_std::allocator<Imath_2_5::Vec3<short>_>_>::size
                      (&local_30);
    if (sVar6 <= uVar5) {
      std::vector<Imath_2_5::Vec3<short>,_std::allocator<Imath_2_5::Vec3<short>_>_>::~vector
                ((vector<Imath_2_5::Vec3<short>,_std::allocator<Imath_2_5::Vec3<short>_>_> *)
                 in_stack_ffffffffffffff60);
      uVar1 = 0;
      do {
        uVar8 = uVar1;
        uVar2 = Imath_2_5::Vec3<short>::dimensions();
        if (uVar2 <= uVar1) {
          return;
        }
        uVar2 = 0;
        while( true ) {
          i_00 = uVar2;
          uVar3 = Imath_2_5::Vec3<short>::dimensions();
          if (uVar3 <= uVar2) break;
          Imath_2_5::Vec3<short>::Vec3(&local_76,0);
          psVar7 = Imath_2_5::Vec3<short>::operator[](&local_76,i_00);
          *psVar7 = 1;
          Imath_2_5::Vec3<short>::Vec3(local_88,0);
          Imath_2_5::Box<Imath_2_5::Vec3<short>_>::Box
                    (in_stack_ffffffffffffff60,
                     (Vec3<short> *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                     (Vec3<short> *)CONCAT44(in_stack_ffffffffffffff54,uVar1));
          uVar2 = Imath_2_5::Box<Imath_2_5::Vec3<short>_>::majorAxis(in_stack_ffffffffffffff60);
          if (uVar2 != i_00) {
            __assert_fail("b.majorAxis() == j",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                          ,0x3c2,
                          "void (anonymous namespace)::testMajorAxis(const char *) [T = Imath_2_5::Vec3<short>]"
                         );
          }
          uVar2 = i_00 + 1;
        }
        uVar1 = uVar8 + 1;
      } while( true );
    }
    Imath_2_5::Vec3<short>::Vec3(local_52,0);
    std::vector<Imath_2_5::Vec3<short>,_std::allocator<Imath_2_5::Vec3<short>_>_>::operator[]
              (&local_30,(ulong)local_40);
    Imath_2_5::Box<Imath_2_5::Vec3<short>_>::Box
              (in_stack_ffffffffffffff60,
               (Vec3<short> *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               (Vec3<short> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    local_58 = 0;
    in_stack_ffffffffffffff60 =
         (Box<Imath_2_5::Vec3<short>_> *)
         std::vector<Imath_2_5::Vec3<short>,_std::allocator<Imath_2_5::Vec3<short>_>_>::operator[]
                   (&local_30,(ulong)local_40);
    Imath_2_5::Vec3<short>::Vec3(&local_64,0);
    Imath_2_5::Vec3<short>::operator-
              ((Vec3<short> *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               (Vec3<short> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    local_68 = 1;
    while( true ) {
      in_stack_ffffffffffffff5c = local_68;
      uVar1 = Imath_2_5::Vec3<short>::dimensions();
      if (uVar1 <= in_stack_ffffffffffffff5c) break;
      psVar7 = Imath_2_5::Vec3<short>::operator[](&local_5e,local_68);
      in_stack_ffffffffffffff58 = (int)*psVar7;
      psVar7 = Imath_2_5::Vec3<short>::operator[](&local_5e,local_58);
      if (*psVar7 < in_stack_ffffffffffffff58) {
        local_58 = local_68;
      }
      local_68 = local_68 + 1;
    }
    in_stack_ffffffffffffff54 =
         Imath_2_5::Box<Imath_2_5::Vec3<short>_>::majorAxis(in_stack_ffffffffffffff60);
    if (in_stack_ffffffffffffff54 != local_58) break;
    local_40 = local_40 + 1;
  }
  __assert_fail("b.majorAxis() == major",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                ,0x3a9,
                "void (anonymous namespace)::testMajorAxis(const char *) [T = Imath_2_5::Vec3<short>]"
               );
}

Assistant:

void
testMajorAxis(const char *type)
{
    cout << "    majorAxis() for type " << type << endl;

    //
    // Empty box.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        assert(b.majorAxis() == 0);
    }

    //
    // Non-empty, has-volume box.
    // Boxes are [ (0, 0, ...), (<all permutations of 1..T::dimensions()>) ]
    //
    {
        std::vector<T> perms;
        permutations(perms);

        for (unsigned int i = 0; i < perms.size(); i++)
        {
            IMATH_INTERNAL_NAMESPACE::Box<T> b(T(0), perms[i]);

            unsigned int major = 0;
            T size = perms[i] - T(0);
            for (unsigned int j = 1; j < T::dimensions(); j++)
                if (size[j] > size[major])
                    major = j;
                    
            assert(b.majorAxis() == major);
        }
    }

    //
    // Non-empty, no-volume box.
    // Boxes are:
    //    2D: [(0, 0), (1, 0) ]
    //    2D: [(0, 0), (0, 1) ]
    //
    //    3D: [(0, 0), (1, 0, 0) ]
    //    3D: [(0, 0), (0, 1, 0) ]
    //    3D: [(0, 0), (0, 0, 1) ]
    //
    //    and similarly for 4D
    //
    {
        for (unsigned int i = 0; i < T::dimensions(); i++)
        {
            for (unsigned int j = 0; j < T::dimensions(); j++)
            {
                T max(0);
                max[j] = 1;

                IMATH_INTERNAL_NAMESPACE::Box<T> b(T(0), max);
                assert(b.majorAxis() == j);
            }
        }
    }
}